

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_ppu.h
# Opt level: O0

void nes_ppu_execute(nes_ppu *ppu)

{
  undefined4 uVar1;
  char cVar2;
  bool bVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  byte bVar8;
  short sVar9;
  bool local_8d;
  bool local_7d;
  ushort local_7c;
  uint pos_y_1;
  uint tile_index_1;
  uint16_t pattern_table_1;
  uint pos_y;
  uint tile_index;
  uint16_t pattern_table;
  nes_ppu_oam_entry current_oam;
  uint32_t max_oam_index;
  uint32_t current_oam_index;
  uint8_t pos;
  int copy_oam;
  uint pattern;
  uint sprite_shift;
  int i_2;
  uint bg_shift_x;
  uint32_t palette_index_1;
  uint bg_pattern;
  int x;
  uint sprite_height;
  int is_next_render_enabled;
  int is_render_enabled;
  byte local_1e;
  uint8_t bit_mask;
  uint32_t i_1;
  uint8_t palette_index;
  uint8_t open_bus_refresh_bits;
  uint32_t i;
  uint8_t open_bus_mask;
  nes_ppu_render_mask next_render_mask;
  nes_ppu *ppu_local;
  
  i = ppu->next_render_mask;
  uVar5 = ppu->dot + 1;
  ppu->dot = uVar5;
  if (0x154 < uVar5) {
    ppu->scanline = (ppu->scanline + 1) % 0x106;
    ppu->dot = 0;
  }
  local_7d = false;
  if ((char)(ppu->status).b < '\0') {
    local_7d = (char)(ppu->ctrl).b < '\0';
  }
  ppu->field_0xa = ppu->field_0xa & 0xdf | local_7d << 5;
  if (ppu->scanline == 0xf1) {
    if (ppu->dot == 0) {
      ppu->pre_vblank = '\x01';
    }
    else if (ppu->dot == 1) {
      (ppu->status).b = (ppu->status).b & 0x7f | ppu->pre_vblank << 7;
    }
  }
  else if ((ppu->scanline == 0x105) && (ppu->dot == 1)) {
    (ppu->status).b = (ppu->status).b & 0x7f;
    (ppu->status).b = (ppu->status).b & 0xbf;
    (ppu->status).b = (ppu->status).b & 0xdf;
    ppu->is_even_frame = (uint)((ppu->is_even_frame != 0 ^ 0xffU) & 1);
    open_bus_refresh_bits = '\0';
    for (i_1 = 0; i_1 < 8; i_1 = i_1 + 1) {
      bVar8 = ppu->open_bus_decay_timer[i_1];
      ppu->open_bus_decay_timer[i_1] = bVar8 + 1;
      open_bus_refresh_bits = open_bus_refresh_bits | (bVar8 < 0x24) << ((byte)i_1 & 0x1f);
    }
    ppu->open_bus = ppu->open_bus & open_bus_refresh_bits;
  }
  if (((byte)ppu->field_0xa >> 3 & 1) != 0 || ((byte)ppu->field_0xa >> 4 & 1) != 0) {
    if (((0xef < ppu->scanline) && (ppu->scanline != 0x105)) ||
       ((ppu->render_mask & NES_PPU_RENDER_MASK_RENDER) == 0)) {
      sVar9 = 1;
      if (((ppu->ctrl).b >> 2 & 1) != 0) {
        sVar9 = 0x20;
      }
      ppu->vram_address = ppu->vram_address + sVar9;
    }
    if (ppu->update_cpu_read_buffer != 0) {
      ppu->cpu_read_buffer = ppu->vram_data;
      ppu->update_cpu_read_buffer = 0;
    }
    ppu->field_0xa = ppu->field_0xa & 0xef;
    ppu->field_0xa = ppu->field_0xa & 0xf7;
  }
  if (ppu->reg_rw_mode != '\0') {
    bit_mask = '\0';
    if (ppu->reg_rw_mode == '\x01') {
      ppu->reg_data = ppu->open_bus;
    }
    else {
      bit_mask = 0xff;
    }
    switch(ppu->field_0xa & 7) {
    case 0:
      if (ppu->reg_rw_mode == '\x02') {
        ppu->ctrl = (nes_ppu_ctrl_reg)ppu->reg_data;
        (ppu->field_11).t_addr_reg =
             (ppu->field_11).t_addr_reg & 0xf3ff | (ushort)((ppu->ctrl).b & 3) << 10;
      }
      break;
    case 1:
      if (ppu->reg_rw_mode == '\x02') {
        i = (uint32_t)ppu->reg_data;
      }
      break;
    case 2:
      if (ppu->reg_rw_mode == '\x01') {
        ppu->reg_data = (ppu->status).b & 0xe0 | ppu->open_bus & 0x1f;
        (ppu->status).b = (ppu->status).b & 0x7f;
        ppu->write_toggle = 0;
        ppu->pre_vblank = '\0';
        bit_mask = 0xe0;
      }
      break;
    case 3:
      if (ppu->reg_rw_mode == '\x02') {
        ppu->oam_address = ppu->reg_data;
      }
      break;
    case 4:
      if (ppu->reg_rw_mode == '\x02') {
        if ((ppu->oam_address & 3) == 2) {
          bVar8 = ppu->reg_data & 0xe3;
        }
        else {
          bVar8 = ppu->reg_data;
        }
        ppu->sprite_shift_high[(ulong)ppu->oam_address + 0x25] = bVar8;
        ppu->oam_address = ppu->oam_address + '\x01';
      }
      else {
        ppu->reg_data = ppu->sprite_shift_high[(ulong)ppu->oam_address + 0x25];
        bit_mask = 0xff;
      }
      break;
    case 5:
      if (ppu->reg_rw_mode == '\x02') {
        if (ppu->write_toggle == 0) {
          (ppu->field_11).t_addr_reg =
               (ppu->field_11).t_addr_reg & 0xffe0 | (ushort)((int)(uint)ppu->reg_data >> 3);
          ppu->fine_x = ppu->reg_data & 7;
        }
        else {
          (ppu->field_11).t_addr_reg =
               (ppu->field_11).t_addr_reg & 0xfc1f | (short)((int)(uint)ppu->reg_data >> 3) << 5;
          (ppu->field_11).t_addr_reg =
               (ppu->field_11).t_addr_reg & 0x8fff | (ppu->reg_data & 7) << 0xc;
        }
        ppu->write_toggle = (uint)((ppu->write_toggle != 0 ^ 0xffU) & 1);
      }
      break;
    case 6:
      if (ppu->reg_rw_mode == '\x02') {
        if (ppu->write_toggle == 0) {
          (ppu->field_11).t_addr_reg = (ppu->reg_data & 0x7f) << 8 | ppu->vram_address & 0xff;
        }
        else {
          (ppu->field_11).t_addr_reg = (ppu->field_11).t_addr_reg & 0xff00 | (ushort)ppu->reg_data;
          ppu->field_10 = (anon_union_2_2_812c8e36_for_nes_ppu_10)ppu->field_11;
          ppu->vram_address = (uint16_t)ppu->field_11;
        }
        ppu->write_toggle = (uint)((ppu->write_toggle != 0 ^ 0xffU) & 1);
      }
      break;
    case 7:
      if ((ppu->vram_address < 0x3f00) || (0x3fff < ppu->vram_address)) {
        if (ppu->reg_rw_mode == '\x02') {
          ppu->field_0xa = ppu->field_0xa & 0xef | 0x10;
          ppu->vram_data = ppu->reg_data;
        }
        else {
          ppu->field_0xa = ppu->field_0xa & 0xf7 | 8;
          ppu->reg_data = ppu->cpu_read_buffer;
          ppu->update_cpu_read_buffer = 1;
          bit_mask = 0xff;
        }
      }
      else {
        bVar8 = (byte)ppu->vram_address;
        local_1e = bVar8 & 0x1f;
        if ((bVar8 & 0x13) == 0x10) {
          local_1e = bVar8 & 0xf;
        }
        if (ppu->reg_rw_mode == '\x02') {
          ppu->palettes[local_1e] = ppu->reg_data;
          if (((0xef < ppu->scanline) && (ppu->scanline != 0x105)) ||
             ((ppu->render_mask & NES_PPU_RENDER_MASK_RENDER) == 0)) {
            sVar9 = 1;
            if (((ppu->ctrl).b >> 2 & 1) != 0) {
              sVar9 = 0x20;
            }
            ppu->vram_address = ppu->vram_address + sVar9;
          }
        }
        else {
          ppu->field_0xa = ppu->field_0xa & 0xf7 | 8;
          ppu->reg_data = ppu->palettes[local_1e] & 0x3f | ppu->open_bus & 0xc0;
          ppu->update_cpu_read_buffer = 1;
          bit_mask = '?';
        }
      }
      if (((ppu->scanline < 0xf0) || (ppu->scanline == 0x105)) &&
         ((ppu->render_mask & NES_PPU_RENDER_MASK_RENDER) != 0)) {
        if (((ppu->field_10).v_addr_reg & 0x1f) == 0x1f) {
          (ppu->field_10).v_addr_reg =
               (ppu->field_10).v_addr_reg & 0xf3ff |
               ((ppu->field_10).v_addr_reg >> 10 & 3 ^ 1) << 10;
          (ppu->field_10).v_addr_reg = (ppu->field_10).v_addr_reg & 0xffe0;
        }
        else {
          (ppu->field_10).v_addr_reg =
               (ppu->field_10).v_addr_reg & 0xffe0 | ((ppu->field_10).v_addr_reg & 0x1f) + 1 & 0x1f;
        }
        if (((ppu->field_10).v_addr_reg >> 0xc & 7) < 7) {
          (ppu->field_10).v_addr_reg =
               (ppu->field_10).v_addr_reg & 0x8fff |
               (((ppu->field_10).v_addr_reg >> 0xc & 7) + 1 & 7) << 0xc;
        }
        else {
          (ppu->field_10).v_addr_reg = (ppu->field_10).v_addr_reg & 0x8fff;
          if (((ppu->field_10).v_addr_reg >> 5 & 0x1f) == 0x1d) {
            (ppu->field_10).v_addr_reg = (ppu->field_10).v_addr_reg & 0xfc1f;
            (ppu->field_10).v_addr_reg =
                 (ppu->field_10).v_addr_reg & 0xf3ff |
                 ((ppu->field_10).v_addr_reg >> 10 & 3 ^ 2) << 10;
          }
          else if (((ppu->field_10).v_addr_reg >> 5 & 0x1f) == 0x1f) {
            (ppu->field_10).v_addr_reg = (ppu->field_10).v_addr_reg & 0xfc1f;
          }
          else {
            (ppu->field_10).v_addr_reg =
                 (ppu->field_10).v_addr_reg & 0xfc1f |
                 (((ppu->field_10).v_addr_reg >> 5 & 0x1f) + 1 & 0x1f) << 5;
          }
        }
      }
    }
    if (bit_mask != '\0') {
      ppu->open_bus = ppu->reg_data;
      for (is_render_enabled = 0; (uint)is_render_enabled < 8;
          is_render_enabled = is_render_enabled + 1) {
        if ((bit_mask & (byte)(1 << ((byte)is_render_enabled & 0x1f))) != 0) {
          ppu->open_bus_decay_timer[(uint)is_render_enabled] = '\0';
        }
      }
    }
    ppu->reg_rw_mode = '\0';
  }
  if (((ppu->render_mask & NES_PPU_RENDER_MASK_RENDER) != 0) == ((i & 0x18) != 0)) {
    ppu->next_render_mask = i;
    ppu->render_mask = i;
  }
  else {
    ppu->render_mask =
         ppu->render_mask & NES_PPU_RENDER_MASK_RENDER | i & ~NES_PPU_RENDER_MASK_RENDER;
  }
  if (((ppu->scanline < 0xf0) || (ppu->scanline == 0x105)) &&
     ((ppu->render_mask & NES_PPU_RENDER_MASK_RENDER) != 0)) {
    iVar6 = 8 << ((ppu->ctrl).b >> 5 & 1);
    if (ppu->dot < 0x102) {
      iVar7 = ppu->dot - 2;
      bg_shift_x = 0;
      i_2 = 0;
      if (((ppu->render_mask & NES_PPU_RENDER_MASK_BACKGROUND) != 0) &&
         (((ppu->render_mask & NES_PPU_RENDER_MASK_LEFTMOST_BACKGROUND) != 0 || (7 < iVar7)))) {
        cVar2 = -ppu->fine_x;
        bg_shift_x = (int)(uint)ppu->bg_shift_low >> (cVar2 + 0xfU & 0x1f) & 1U |
                     (int)(uint)ppu->bg_shift_high >> (cVar2 + 0xeU & 0x1f) & 2U;
        if (bg_shift_x != 0) {
          i_2 = bg_shift_x | (int)(uint)ppu->attr_shift_low >> (cVar2 + 0xdU & 0x1f) & 4U |
                (int)(uint)ppu->attr_shift_high >> (cVar2 + 0xcU & 0x1f) & 8U;
        }
      }
      if (((ppu->render_mask & NES_PPU_RENDER_MASK_SPRITES) != 0) &&
         (((ppu->render_mask & NES_PPU_RENDER_MASK_LEFTMOST_SPRITES) != 0 || (7 < iVar7)))) {
        for (pattern = 0; (int)pattern < 8; pattern = pattern + 1) {
          if ((((int)(uint)ppu->sprite_x_positions[(int)pattern] <= iVar7) &&
              (iVar7 < (int)(ppu->sprite_x_positions[(int)pattern] + 8))) &&
             (bVar8 = 7 - ((char)iVar7 - ppu->sprite_x_positions[(int)pattern]) & 7,
             uVar5 = ((int)(uint)ppu->sprite_shift_high[(int)pattern] >> bVar8 & 1U) << 1 |
                     (int)(uint)ppu->sprite_shift_low[(int)pattern] >> bVar8 & 1U, uVar5 != 0)) {
            if (((pattern == 0) && (ppu->sprite_0_test != '\0')) &&
               (((ppu->status).b >> 6 & 1) == 0)) {
              local_8d = bg_shift_x != 0 && iVar7 != 0xff;
              (ppu->status).b = (ppu->status).b & 0xbf | local_8d << 6;
            }
            if ((bg_shift_x == 0) || ((ppu->sprite_attributes[(int)pattern].b >> 5 & 1) == 0)) {
              i_2 = uVar5 | (uint)(ppu->sprite_attributes[(int)pattern].b & 3) << 2 | 0x10;
            }
            break;
          }
        }
      }
      ppu->color_out = ppu->palettes[(uint)i_2];
      if ((ppu->render_mask & NES_PPU_RENDER_MASK_GRAYSCALE) != 0) {
        ppu->color_out = ppu->color_out & 0x30;
      }
    }
    else {
      ppu->color_out = '\x0f';
    }
    if (((1 < ppu->dot) && (ppu->dot < 0x102)) || ((0x141 < ppu->dot && (ppu->dot < 0x152)))) {
      ppu->bg_shift_high = ppu->bg_shift_high << 1;
      ppu->bg_shift_low = ppu->bg_shift_low << 1;
      ppu->attr_shift_high = ppu->attr_shift_high << 1;
      ppu->attr_shift_low = ppu->attr_shift_low << 1;
    }
    if ((ppu->dot == 0) || ((0x100 < ppu->dot && ((ppu->dot < 0x141 || (0x150 < ppu->dot)))))) {
      if (ppu->dot == 0x101) {
        (ppu->field_10).v_addr_reg =
             (ppu->field_10).v_addr_reg & 0xfbe0 | (ppu->field_11).t_addr_reg & 0x41f;
      }
      if ((((ppu->render_mask & NES_PPU_RENDER_MASK_SPRITES) != 0) && (ppu->dot != 0)) &&
         (ppu->dot < 0x141)) {
        uVar5 = ppu->dot - 0x101 >> 3;
        bVar8 = ppu->eval_oam_byte_count;
        uVar1 = *(undefined4 *)(ppu->palettes + (ulong)uVar5 * 4 + -0x20);
        ppu->oam_address = '\0';
        ppu->sprite_0_test = ppu->eval_oam_has_sprite_zero;
        tile_index._2_1_ = (byte)((uint)uVar1 >> 0x10);
        tile_index._1_1_ = (byte)((uint)uVar1 >> 8);
        sVar9 = (short)iVar6;
        switch(ppu->dot & 7) {
        case 0:
          if ((tile_index._2_1_ >> 6 & 1) == 0) {
            ppu->sprite_shift_high[uVar5] = ppu->vram_data;
          }
          else {
            ppu->sprite_shift_high[uVar5] =
                 (uint8_t)(((ulong)ppu->vram_data * 0x80200802 & 0x884422110) * 0x101010101 >> 0x20)
            ;
          }
          if (bVar8 >> 2 <= uVar5) {
            ppu->sprite_shift_high[uVar5] = '\0';
            ppu->sprite_shift_low[uVar5] = '\0';
          }
          break;
        case 1:
          ppu->sprite_attributes[uVar5].b = tile_index._2_1_;
          break;
        case 2:
          tile_index._3_1_ = (uint8_t)((uint)uVar1 >> 0x18);
          ppu->sprite_x_positions[uVar5] = tile_index._3_1_;
          break;
        case 3:
          break;
        case 4:
          break;
        case 5:
          pos_y._2_2_ = (ushort)((ppu->ctrl).b >> 3 & 1);
          uVar4 = (ushort)tile_index._1_1_;
          if (((ppu->ctrl).b >> 5 & 1) != 0) {
            pos_y._2_2_ = tile_index._1_1_ & 1;
            uVar4 = uVar4 & 0xfffe;
          }
          tile_index_1._0_2_ = (short)ppu->scanline - ((ushort)uVar1 & 0xff);
          if ((char)tile_index._2_1_ < '\0') {
            tile_index_1._0_2_ = (sVar9 - (ushort)tile_index_1) - 1;
          }
          ppu->field_0xa = ppu->field_0xa & 0xf7 | 8;
          ppu->vram_address =
               pos_y._2_2_ << 0xc | uVar4 << 4 | ((ushort)tile_index_1 & 8) + (ushort)tile_index_1;
          break;
        case 6:
          if ((tile_index._2_1_ >> 6 & 1) == 0) {
            ppu->sprite_shift_low[uVar5] = ppu->vram_data;
          }
          else {
            ppu->sprite_shift_low[uVar5] =
                 (uint8_t)(((ulong)ppu->vram_data * 0x80200802 & 0x884422110) * 0x101010101 >> 0x20)
            ;
          }
          break;
        case 7:
          pos_y_1._2_2_ = (ushort)((ppu->ctrl).b >> 3 & 1);
          uVar4 = (ushort)tile_index._1_1_;
          if (((ppu->ctrl).b >> 5 & 1) != 0) {
            pos_y_1._2_2_ = tile_index._1_1_ & 1;
            uVar4 = uVar4 & 0xfffe;
          }
          local_7c = (short)ppu->scanline - ((ushort)uVar1 & 0xff);
          if ((char)tile_index._2_1_ < '\0') {
            local_7c = (sVar9 - local_7c) - 1;
          }
          ppu->field_0xa = ppu->field_0xa & 0xf7 | 8;
          ppu->vram_address = pos_y_1._2_2_ << 0xc | uVar4 << 4 | (local_7c & 8) + local_7c + 8;
        }
      }
      if (ppu->scanline == 0x105) {
        if ((ppu->dot < 0x118) || (0x130 < ppu->dot)) {
          if ((ppu->dot == 0x153) && (ppu->is_even_frame == 0)) {
            ppu->dot = 0x154;
          }
        }
        else {
          (ppu->field_10).v_addr_reg =
               (ppu->field_10).v_addr_reg & 0x841f | (ppu->field_11).t_addr_reg & 0x7be0;
        }
      }
    }
    else {
      switch(ppu->dot & 7) {
      case 0:
        if (((ppu->field_10).v_addr_reg & 0x1f) == 0x1f) {
          (ppu->field_10).v_addr_reg =
               (ppu->field_10).v_addr_reg & 0xf3ff |
               ((ppu->field_10).v_addr_reg >> 10 & 3 ^ 1) << 10;
          (ppu->field_10).v_addr_reg = (ppu->field_10).v_addr_reg & 0xffe0;
        }
        else {
          (ppu->field_10).v_addr_reg =
               (ppu->field_10).v_addr_reg & 0xffe0 | ((ppu->field_10).v_addr_reg & 0x1f) + 1 & 0x1f;
        }
        if (ppu->dot == 0x100) {
          if (((ppu->field_10).v_addr_reg >> 0xc & 7) < 7) {
            (ppu->field_10).v_addr_reg =
                 (ppu->field_10).v_addr_reg & 0x8fff |
                 (((ppu->field_10).v_addr_reg >> 0xc & 7) + 1 & 7) << 0xc;
          }
          else {
            (ppu->field_10).v_addr_reg = (ppu->field_10).v_addr_reg & 0x8fff;
            if (((ppu->field_10).v_addr_reg >> 5 & 0x1f) == 0x1d) {
              (ppu->field_10).v_addr_reg = (ppu->field_10).v_addr_reg & 0xfc1f;
              (ppu->field_10).v_addr_reg =
                   (ppu->field_10).v_addr_reg & 0xf3ff |
                   ((ppu->field_10).v_addr_reg >> 10 & 3 ^ 2) << 10;
            }
            else if (((ppu->field_10).v_addr_reg >> 5 & 0x1f) == 0x1f) {
              (ppu->field_10).v_addr_reg = (ppu->field_10).v_addr_reg & 0xfc1f;
            }
            else {
              (ppu->field_10).v_addr_reg =
                   (ppu->field_10).v_addr_reg & 0xfc1f |
                   (((ppu->field_10).v_addr_reg >> 5 & 0x1f) + 1 & 0x1f) << 5;
            }
          }
        }
        break;
      case 1:
        ppu->bg_shift_high = ppu->bg_shift_high | (ushort)ppu->vram_data;
        ppu->bg_shift_low = ppu->bg_shift_low | (ushort)ppu->bitplane_slice_low;
        ppu->attr_shift_low = ppu->attr_shift_low | (ppu->palette_attribute & 1) * 0xff;
        ppu->attr_shift_high =
             ppu->attr_shift_high | ((ushort)((int)(uint)ppu->palette_attribute >> 1) & 1) * 0xff;
        ppu->field_0xa = ppu->field_0xa & 0xf7 | 8;
        ppu->vram_address = (ppu->field_10).v_addr_reg & 0xfff | 0x2000;
        break;
      case 2:
        ppu->tile_value = ppu->vram_data;
        break;
      case 3:
        ppu->field_0xa = ppu->field_0xa & 0xf7 | 8;
        ppu->vram_address =
             (ppu->field_10).v_addr_reg & 0xc00 | 0x23c0 |
             (ushort)((int)(uint)(ppu->field_10).v_addr_reg >> 4) & 0x38 |
             (ushort)((int)(uint)(ppu->field_10).v_addr_reg >> 2) & 7;
        break;
      case 4:
        ppu->palette_attribute = ppu->vram_data;
        if (((ppu->field_10).v_addr_reg >> 5 & 2) != 0) {
          ppu->palette_attribute = (uint8_t)((int)(uint)ppu->palette_attribute >> 4);
        }
        if (((ppu->field_10).v_addr_reg & 2) != 0) {
          ppu->palette_attribute = (uint8_t)((int)(uint)ppu->palette_attribute >> 2);
        }
        break;
      case 5:
        ppu->field_0xa = ppu->field_0xa & 0xf7 | 8;
        ppu->vram_address =
             (ushort)((ppu->ctrl).b >> 4 & 1) << 0xc | (ushort)ppu->tile_value << 4 |
             (ppu->field_10).v_addr_reg >> 0xc & 7;
        break;
      case 6:
        ppu->bitplane_slice_low = ppu->vram_data;
        break;
      case 7:
        ppu->field_0xa = ppu->field_0xa & 0xf7 | 8;
        ppu->vram_address =
             (ushort)((ppu->ctrl).b >> 4 & 1) << 0xc | (ushort)ppu->tile_value << 4 | 8 |
             (ppu->field_10).v_addr_reg >> 0xc & 7;
      }
      if (ppu->dot == 1) {
        ppu->eval_oam_has_sprite_zero = '\0';
        ppu->eval_oam_byte_count = '\0';
        ppu->eval_oam_src_addr = '\0';
      }
      if (ppu->dot < 0x101) {
        if (ppu->dot < 0x41) {
          ppu->palettes[(ulong)(ppu->dot - 1 >> 1) - 0x20] = 0xff;
        }
        else if ((ppu->dot & 1) == 0) {
          if (ppu->eval_oam_src_addr <= ppu->oam_address) {
            ppu->eval_oam_src_addr = ppu->oam_address;
            bVar3 = true;
            if ((ppu->eval_oam_byte_count & 3) == 0) {
              bVar8 = ppu->eval_oam_entry_data;
              if (((bVar8 < 0xf0) && ((uint)bVar8 <= ppu->scanline)) &&
                 (ppu->scanline < (uint)bVar8 + iVar6)) {
                if (ppu->dot == 0x42) {
                  ppu->eval_oam_has_sprite_zero = '\x01';
                }
                if (ppu->eval_oam_byte_count == ' ') {
                  (ppu->status).b = (ppu->status).b & 0xdf | 0x20;
                }
              }
              else {
                bVar3 = false;
              }
            }
            if (bVar3) {
              if (ppu->eval_oam_byte_count < 0x20) {
                bVar8 = ppu->eval_oam_byte_count;
                ppu->eval_oam_byte_count = bVar8 + 1;
                ppu->palettes[(ulong)bVar8 - 0x20] = ppu->eval_oam_entry_data;
              }
              ppu->oam_address = ppu->oam_address + '\x01';
            }
            else {
              ppu->oam_address = ppu->oam_address + '\x04';
              if (ppu->eval_oam_byte_count == ' ') {
                ppu->oam_address = ppu->oam_address & 0xfc | ppu->oam_address + 1 & 3;
              }
            }
          }
        }
        else {
          ppu->eval_oam_entry_data = ppu->sprite_shift_high[(ulong)ppu->oam_address + 0x25];
        }
      }
    }
  }
  ppu->render_mask = ppu->next_render_mask;
  ppu->next_render_mask = i;
  return;
}

Assistant:

static void nes_ppu_execute(nes_ppu* __restrict ppu)
{
    nes_ppu_render_mask next_render_mask = ppu->next_render_mask;

    // Update dot and scanline
    if (++ppu->dot >= SCANLINE_WIDTH)
    {
        ppu->scanline = (ppu->scanline + 1) % TOTAL_SCANLINES;
        ppu->dot = 0;
    }

    // VBlank

    ppu->vbl = ppu->status.vblank_started && ppu->ctrl.generate_nmi;

    if (ppu->scanline == VBLANK_BEGIN_SCANLINE)
    {
        if (ppu->dot == 0)      ppu->pre_vblank = 1;
        else if (ppu->dot == 1) ppu->status.vblank_started = ppu->pre_vblank;
    }
    else if (ppu->scanline == PRE_RENDER_SCANLINE && ppu->dot == 1)
    {
        // Clear VBlank, Sprite 0 Hit, Sprite overflow and toggle odd/even flag
        ppu->status.vblank_started = 0;
        ppu->status.sprite_0_hit = 0;
        ppu->status.sprite_overflow = 0;
        ppu->is_even_frame = !ppu->is_even_frame;

        // open bus decay
        uint8_t open_bus_mask = 0;
        for (uint32_t i = 0; i < 8; ++i)
            open_bus_mask |= (ppu->open_bus_decay_timer[i]++ < 36) << i;    // 36 * 16.6ms = ~600ms

        ppu->open_bus &= open_bus_mask;
    }

    // I/O:

    if (ppu->r | ppu->w)
    {
        if (!_NES_PPU_IS_RENDERING(ppu))
            ppu->vram_address += ppu->ctrl.vram_rw_increment_step ? 32 : 1;

        if (ppu->update_cpu_read_buffer)
        {
            ppu->cpu_read_buffer = ppu->vram_data;
            ppu->update_cpu_read_buffer = 0;
        }
        ppu->r = ppu->w = 0;
    }

    if (ppu->reg_rw_mode)
    {
        uint8_t open_bus_refresh_bits = 0;

        if (ppu->reg_rw_mode == NES_PPU_REG_RW_MODE_READ)
            ppu->reg_data = ppu->open_bus;
        else
            open_bus_refresh_bits = 0xFF;

        switch(ppu->reg_addr)
        {
            case NES_PPU_CTRL_REG_ID:   // write-only 
            {
                if (ppu->reg_rw_mode == NES_PPU_REG_RW_MODE_WRITE)
                {
                    ppu->ctrl.b = ppu->reg_data;
                    ppu->t_addr.nametable = ppu->ctrl.base_nametable_addr;
                }
            }
            break;
            case NES_PPU_MASK_REG_ID:   // write-only
            {
                if (ppu->reg_rw_mode == NES_PPU_REG_RW_MODE_WRITE)
                    next_render_mask = (nes_ppu_render_mask)ppu->reg_data;
            }
            break;
            case NES_PPU_STATUS_REG_ID: // read-only
            {
                if (ppu->reg_rw_mode == NES_PPU_REG_RW_MODE_READ)
                {
                    ppu->reg_data = (ppu->status.b & 0xE0) | (ppu->open_bus & 0x1F);
                    ppu->status.vblank_started = 0;
                    ppu->write_toggle = 0;
                    ppu->pre_vblank = 0;
                    open_bus_refresh_bits = 0xE0;
                }
            }
            break;
            case NES_PPU_OAM_ADDR_REG_ID: // write-only
            {
                if (ppu->reg_rw_mode == NES_PPU_REG_RW_MODE_WRITE)
                    ppu->oam_address = ppu->reg_data;
            }
            break;
            case NES_PPU_OAM_DATA_REG_ID: // read-write
            {
                if (ppu->reg_rw_mode == NES_PPU_REG_RW_MODE_WRITE)
                {
                    // sprite attribute bits 2-4 are always 0
                    ppu->primary_oam.bytes[ppu->oam_address] = (ppu->oam_address & 3) == 2 ? ppu->reg_data & 0xE3 : ppu->reg_data;
                    ++ppu->oam_address;
                }
                else
                {
                    ppu->reg_data = ppu->primary_oam.bytes[ppu->oam_address];
                    open_bus_refresh_bits = 0xFF;
                }
            }
            break;
            case NES_PPU_SCROLL_REG_ID: // write-only
            {
                if(ppu->reg_rw_mode == NES_PPU_REG_RW_MODE_WRITE)
                {
                    if(ppu->write_toggle)
                    {
                        ppu->t_addr.coarse_y = ppu->reg_data >> 3;
                        ppu->t_addr.fine_y = ppu->reg_data & 7;
                    }
                    else
                    {
                        ppu->t_addr.coarse_x = ppu->reg_data >> 3;
                        ppu->fine_x = ppu->reg_data & 7;
                    }
                    ppu->write_toggle = !ppu->write_toggle; 
                }
            }
            break;
            case NES_PPU_ADDR_REG_ID: // write-only
            {
                if (ppu->reg_rw_mode == NES_PPU_REG_RW_MODE_WRITE)
                {
                    if (ppu->write_toggle)
                    {
                        ppu->t_addr_reg = (ppu->t_addr_reg & 0xFF00) | ppu->reg_data;
                        ppu->v_addr_reg = ppu->t_addr_reg;
                        ppu->vram_address = ppu->t_addr_reg;
                    }
                    else
                    {
                        ppu->t_addr_reg = ((ppu->reg_data & 0x7F) << 8) | (ppu->vram_address & 0x00FF);
                    }
                    ppu->write_toggle = !ppu->write_toggle;
                }
            }
            break;
            case NES_PPU_DATA_REG_ID: // read-write
            {
                if (ppu->vram_address >= 0x3F00 && ppu->vram_address <= 0x3FFF)
                {
                    uint8_t palette_index = ppu->vram_address & 0x1F;
                    if ((palette_index & 0x13) == 0x10)
                        palette_index &= ~0x10;

                    if (ppu->reg_rw_mode == NES_PPU_REG_RW_MODE_WRITE)
                    {
                        ppu->palettes[palette_index] = ppu->reg_data;

                        if (!_NES_PPU_IS_RENDERING(ppu))
                            ppu->vram_address += ppu->ctrl.vram_rw_increment_step ? 32 : 1;
                    }
                    else
                    {
                        ppu->r = 1;
                        ppu->reg_data = (ppu->palettes[palette_index] & 0x3F) | (ppu->open_bus & 0xC0);
                        ppu->update_cpu_read_buffer = 1;
                        open_bus_refresh_bits = 0x3F;
                    }
                }
                else
                {
                    if (ppu->reg_rw_mode == NES_PPU_REG_RW_MODE_WRITE)
                    {
                        ppu->w = 1;
                        ppu->vram_data = ppu->reg_data;
                    }
                    else
                    {
                        ppu->r = 1;
                        ppu->reg_data = ppu->cpu_read_buffer;
                        ppu->update_cpu_read_buffer = 1;
                        open_bus_refresh_bits = 0xFF;
                    }
                }

                // If rendering immediately increment X and Y scroll
                if (_NES_PPU_IS_RENDERING(ppu))
                {
                    if (ppu->v_addr.coarse_x == 31)
                    {
                        ppu->v_addr.nametable ^= 1;
                        ppu->v_addr.coarse_x = 0;
                    }
                    else
                    {
                        ppu->v_addr.coarse_x++;
                    }

                    if (ppu->v_addr.fine_y < 7)
                    {
                        ppu->v_addr.fine_y++;
                    }
                    else
                    {
                        ppu->v_addr.fine_y = 0;
                        if (ppu->v_addr.coarse_y == 29)
                        {
                            ppu->v_addr.coarse_y = 0;
                            ppu->v_addr.nametable ^= 2;
                        }
                        else if (ppu->v_addr.coarse_y == 31)
                        {
                            ppu->v_addr.coarse_y = 0;
                        }
                        else
                        {
                            ppu->v_addr.coarse_y++;
                        }
                    }
                }
            }
            break;
        }

        if (open_bus_refresh_bits)
        {
            ppu->open_bus = ppu->reg_data;

            for (uint32_t i = 0; i < 8; ++i)
            {
                uint8_t bit_mask = 1 << i;
                if (open_bus_refresh_bits & bit_mask)
                    ppu->open_bus_decay_timer[i] = 0;
            }
        }

        ppu->reg_rw_mode = NES_PPU_REG_RW_MODE_NONE;
    }

    // Rendering

    int is_render_enabled      = (ppu->render_mask & NES_PPU_RENDER_MASK_RENDER) != 0;
    int is_next_render_enabled = (next_render_mask & NES_PPU_RENDER_MASK_RENDER) != 0;

    if (is_render_enabled == is_next_render_enabled)
    {
        ppu->render_mask = ppu->next_render_mask = next_render_mask;
    }
    else
    {
        ppu->render_mask = (nes_ppu_render_mask)((ppu->render_mask & NES_PPU_RENDER_MASK_RENDER) | (next_render_mask & ~NES_PPU_RENDER_MASK_RENDER));
    }

    if (_NES_PPU_IS_RENDERING(ppu))
    {
        const unsigned sprite_height = 8 << ppu->ctrl.sprite_size;

        // Draw pixel
        if (ppu->dot <= 257)
        {
            int x = ppu->dot - 2;
            
            unsigned bg_pattern = 0;
            uint32_t palette_index = 0;
            
            if ((ppu->render_mask & NES_PPU_RENDER_MASK_BACKGROUND) && 
               ((ppu->render_mask & NES_PPU_RENDER_MASK_LEFTMOST_BACKGROUND) || x > 7))
            {
                unsigned bg_shift_x = 15 - ppu->fine_x;
                bg_pattern = ((ppu->bg_shift_low  >> (bg_shift_x))     & 0x01) |
                             ((ppu->bg_shift_high >> (bg_shift_x - 1)) & 0x02);

                if (bg_pattern)
                {
                    palette_index = (bg_pattern |
                                ((ppu->attr_shift_low  >> (bg_shift_x - 2)) & 0x04) | 
                                ((ppu->attr_shift_high >> (bg_shift_x - 3)) & 0x08)) & 0x0F;
                }
            }

            if ((ppu->render_mask & NES_PPU_RENDER_MASK_SPRITES) && 
               ((ppu->render_mask & NES_PPU_RENDER_MASK_LEFTMOST_SPRITES) || x > 7))
            {
                for (int i = 0; i < 8; ++i)
                {
                    if (x >= ppu->sprite_x_positions[i] && (x < ppu->sprite_x_positions[i] + 8))
                    {
                        unsigned sprite_shift = 7 - (x - ppu->sprite_x_positions[i]) & 7;
                        unsigned pattern = (((ppu->sprite_shift_high[i] >> sprite_shift) << 1) & 2) |
                                           ((ppu->sprite_shift_low[i] >> sprite_shift) & 1);

                        if (pattern)
                        {
                            if (i == 0 && ppu->sprite_0_test && ppu->status.sprite_0_hit == 0)
                                ppu->status.sprite_0_hit = bg_pattern && x != 255;

                            if (bg_pattern == 0 || (ppu->sprite_attributes[i].priority == 0))
                                palette_index = pattern | (ppu->sprite_attributes[i].palette << 2) | 0x10;

                            break;
                        }
                    }
                }
            }

            ppu->color_out = ppu->palettes[palette_index];

            if (ppu->render_mask & NES_PPU_RENDER_MASK_GRAYSCALE)
                ppu->color_out &= 0x30;
        }
        else
        {
            ppu->color_out = _NES_PPU_COLOR_BLACK;
        }

        // Shift background shift registers
        if ((ppu->dot >= 2 && ppu->dot <= 257) || (ppu->dot >= 322 && ppu->dot <= 337))
        {
            ppu->bg_shift_high <<= 1;
            ppu->bg_shift_low <<= 1;
            ppu->attr_shift_high <<= 1;
            ppu->attr_shift_low <<= 1;
        }

        if (ppu->dot && (ppu->dot <= 256 || (ppu->dot > 320 && ppu->dot <= 336)))
        {
            // Fetch background data and update shift registers
            switch(ppu->dot & 7)
            {
                case 1:
                    // Reload shift registers
                    ppu->bg_shift_high |= ppu->vram_data;
                    ppu->bg_shift_low |= ppu->bitplane_slice_low;
                    ppu->attr_shift_low |= (ppu->palette_attribute & 1) * 0xFF;
                    ppu->attr_shift_high |= ((ppu->palette_attribute >> 1) & 1) * 0xFF;

                    // Fetch tile from nametable
                    ppu->r = 1;
                    ppu->vram_address = 0x2000 | (ppu->v_addr_reg & 0x0FFF);
                    break;
                case 2:
                    ppu->tile_value = ppu->vram_data;
                    break;
                case 3:
                    // Fetch tile attributes
                    ppu->r = 1;
                    ppu->vram_address = 0x23C0 | (ppu->v_addr_reg & 0x0C00) | ((ppu->v_addr_reg >> 4) & 0x38) | ((ppu->v_addr_reg >> 2) & 0x07);
                    break;
                case 4:
                    ppu->palette_attribute = ppu->vram_data;
                    if (ppu->v_addr.coarse_y & 2) ppu->palette_attribute >>= 4;
                    if (ppu->v_addr.coarse_x & 2) ppu->palette_attribute >>= 2;
                    break;
                case 5:
                    // Fetch low bitplane
                    ppu->r = 1;
                    ppu->vram_address = (ppu->ctrl.bgr_pattern_table_addr << 12) | (ppu->tile_value << 4) | ppu->v_addr.fine_y;
                    break; 
                case 6:
                    ppu->bitplane_slice_low = ppu->vram_data;
                    break;
                case 7:
                    // Fetch high bitplane
                    ppu->r = 1;
                    ppu->vram_address = (ppu->ctrl.bgr_pattern_table_addr << 12) | (ppu->tile_value << 4) | 8 | ppu->v_addr.fine_y;
                    break;
                case 0:
                    // Increment horizontal scrolling
                    if (ppu->v_addr.coarse_x == 31)
                    {
                        ppu->v_addr.nametable ^= 1;
                        ppu->v_addr.coarse_x = 0;
                    }
                    else
                    {
                        ppu->v_addr.coarse_x++;
                    }
            
                    // Increment vertical scrolling
                    if (ppu->dot == 256)
                    {
                        if (ppu->v_addr.fine_y < 7)
                        {
                            ppu->v_addr.fine_y++;
                        }
                        else
                        {
                            ppu->v_addr.fine_y = 0;
                            if (ppu->v_addr.coarse_y == 29)
                            {
                                ppu->v_addr.coarse_y = 0;
                                ppu->v_addr.nametable ^= 2;
                            }
                            else if (ppu->v_addr.coarse_y == 31)
                            {
                                ppu->v_addr.coarse_y = 0;
                            }
                            else
                            {
                                ppu->v_addr.coarse_y++;
                            }
                        }
                    }
                    break;
            }

            // Reset OAM counters at dot 1 of each scanline
            if (ppu->dot == 1)
            {
                ppu->eval_oam_has_sprite_zero = 0;
                ppu->eval_oam_byte_count = 0;
                ppu->eval_oam_src_addr = 0;
            }

            // Sprite evaluation
            if (ppu->scanline >= RENDER_BEGIN_SCANLINE && ppu->dot < 257)
            {
                if (ppu->dot < 65)
                {
                    // clear secondary oam 
                    ppu->secondary_oam.bytes[(ppu->dot - 1) >> 1] = 0xFF;
                }
                else 
                {
                    if (ppu->dot & 1)
                    {
                        ppu->eval_oam_entry_data = ppu->primary_oam.bytes[ppu->oam_address];
                    }
                    else
                    {
                        if (ppu->oam_address >= ppu->eval_oam_src_addr)
                        {
                            ppu->eval_oam_src_addr = ppu->oam_address;

                            int copy_oam = 1;

                            if ((ppu->eval_oam_byte_count & 3) == 0)
                            {
                                uint8_t pos = ppu->eval_oam_entry_data;
                                if (pos < 240 && ppu->scanline >= pos && ppu->scanline < (pos + sprite_height))
                                {
                                    if (ppu->dot == 66)
                                        ppu->eval_oam_has_sprite_zero = 1;

                                    if (ppu->eval_oam_byte_count == 32)
                                        ppu->status.sprite_overflow = 1;
                                }
                                else
                                {
                                    copy_oam = 0;
                                }
                            }

                            if (copy_oam)
                            {
                                if (ppu->eval_oam_byte_count < 32)
                                    ppu->secondary_oam.bytes[ppu->eval_oam_byte_count++] = ppu->eval_oam_entry_data;

                                ppu->oam_address++;
                            }
                            else
                            {
                                ppu->oam_address = (ppu->oam_address + 4);

                                if (ppu->eval_oam_byte_count == 32)
                                    ppu->oam_address = (ppu->oam_address & 0xFC) | ((ppu->oam_address + 1) & 3);
                            }
                        }
                    }
                }
            }
        }
        else
        {
            // Update horizontal scrolling component from T
            if (ppu->dot == 257)
                ppu->v_addr_reg = (ppu->v_addr_reg & ~0x041F) | (ppu->t_addr_reg & 0x041F);

            // Fetch sprite data
            if ((ppu->render_mask & NES_PPU_RENDER_MASK_SPRITES) && ppu->dot && ppu->dot <= 320)
            {
                uint32_t            current_oam_index = (ppu->dot - 257) >> 3;
                uint32_t            max_oam_index = ppu->eval_oam_byte_count >> 2;
                nes_ppu_oam_entry   current_oam = ppu->secondary_oam.entries[current_oam_index];

                ppu->oam_address = 0;
                ppu->sprite_0_test = ppu->eval_oam_has_sprite_zero;

                switch(ppu->dot & 7)
                {
                    case 1: 
                        ppu->sprite_attributes[current_oam_index] = current_oam.attribute;
                        break;
                    case 2:
                        ppu->sprite_x_positions[current_oam_index] = current_oam.position_x;
                        break;
                    case 3:
                        break;
                    case 4:
                        break;
                    case 5:
                        {
                            uint16_t pattern_table = ppu->ctrl.sprite_pattern_table_addr;
                            unsigned tile_index = current_oam.tile_index;
                            if (ppu->ctrl.sprite_size)
                            {
                                pattern_table = current_oam.tile_index & 1;
                                tile_index = tile_index & ~1;
                            }

                            unsigned pos_y = ppu->scanline - current_oam.position_y;

                            if (current_oam.attribute.flip_y)
                                pos_y = sprite_height - pos_y - 1;

                            pos_y += pos_y & 8;
                            
                            ppu->r = 1;
                            ppu->vram_address = (pattern_table << 12) | (tile_index << 4) | pos_y;
                        }
                        break; 
                    case 6:
                        if (current_oam.attribute.flip_x)
                            ppu->sprite_shift_low[current_oam_index] = (uint8_t)(((ppu->vram_data * 0x80200802ULL) & 0x0884422110ULL) * 0x0101010101ULL >> 32);
                        else
                            ppu->sprite_shift_low[current_oam_index] = ppu->vram_data;
                        break;
                    case 7:
                        {
                            uint16_t pattern_table = ppu->ctrl.sprite_pattern_table_addr;
                            unsigned tile_index = current_oam.tile_index;
                            if (ppu->ctrl.sprite_size)
                            {
                                pattern_table = current_oam.tile_index & 1;
                                tile_index = tile_index & ~1;
                            }

                            unsigned pos_y = ppu->scanline - current_oam.position_y;

                            if (current_oam.attribute.flip_y)
                                pos_y = sprite_height - pos_y - 1;

                            pos_y += pos_y & 8;
                            
                            ppu->r = 1;
                            ppu->vram_address = (pattern_table << 12) | (tile_index << 4) | (pos_y + 8);
                        }
                        break;
                    case 0:
                        if (current_oam.attribute.flip_x)
                            ppu->sprite_shift_high[current_oam_index] = (uint8_t)(((ppu->vram_data * 0x80200802ULL) & 0x0884422110ULL) * 0x0101010101ULL >> 32);
                        else
                            ppu->sprite_shift_high[current_oam_index] = ppu->vram_data;

                        // Set sprite to transparent if it's not detected on scanline.
                        if (current_oam_index >= max_oam_index)
                        {
                            ppu->sprite_shift_high[current_oam_index] = 0;
                            ppu->sprite_shift_low[current_oam_index] = 0;
                        }
                        break;
                }
            }
       
            if (ppu->scanline == PRE_RENDER_SCANLINE)
            {
                if (ppu->dot >= 280 && ppu->dot <= 304)
                {
                    // Update vertical scrolling component from T during pre-render scanline
                    ppu->v_addr_reg = (ppu->v_addr_reg & ~0x7BE0) | (ppu->t_addr_reg & 0x7BE0);
                }
                else if (ppu->dot == 339 && !ppu->is_even_frame)
                {
                    // Skip one cycle if odd frame
                    ppu->dot = 340;
                }
            }
        }
    }

    ppu->render_mask = ppu->next_render_mask;
    ppu->next_render_mask = next_render_mask;
}